

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O3

void Assimp::FindAABBTransformed(aiMesh *mesh,aiVector3D *min,aiVector3D *max,aiMatrix4x4 *m)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  aiVector3D *paVar6;
  undefined1 auVar7 [16];
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  min->x = 1e+11;
  min->y = 1e+11;
  min->z = 1e+11;
  max->x = -1e+11;
  max->y = -1e+11;
  max->z = -1e+11;
  if (mesh->mNumVertices != 0) {
    lVar8 = 8;
    uVar9 = 0;
    do {
      paVar6 = mesh->mVertices;
      fVar14 = *(float *)((long)paVar6 + lVar8 + -8);
      fVar17 = *(float *)((long)paVar6 + lVar8 + -4);
      fVar1 = *(float *)((long)&paVar6->x + lVar8);
      fVar18 = m->c3 * fVar1 + m->c1 * fVar14 + m->c2 * fVar17 + m->c4;
      fVar13 = m->a4 + fVar1 * m->a3 + fVar14 * m->a1 + m->a2 * fVar17;
      fVar15 = m->b4 + fVar1 * m->b3 + fVar14 * m->b1 + m->b2 * fVar17;
      fVar16 = m->b2 + fVar1 * m->b1 + fVar14 * m->a3 + m->a4 * fVar17;
      fVar17 = m->b3 + fVar1 * m->b2 + fVar14 * m->a4 + m->b1 * fVar17;
      uVar2 = min->x;
      uVar4 = min->y;
      auVar10._4_4_ = uVar4;
      auVar10._0_4_ = uVar2;
      auVar10._8_8_ = 0;
      auVar11._4_4_ = fVar15;
      auVar11._0_4_ = fVar13;
      auVar11._8_4_ = fVar16;
      auVar11._12_4_ = fVar17;
      auVar11 = minps(auVar10,auVar11);
      fVar14 = min->z;
      if (fVar18 <= min->z) {
        fVar14 = fVar18;
      }
      min->x = (float)(int)auVar11._0_8_;
      min->y = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
      min->z = fVar14;
      uVar3 = max->x;
      uVar5 = max->y;
      auVar12._4_4_ = uVar5;
      auVar12._0_4_ = uVar3;
      auVar12._8_8_ = 0;
      auVar7._4_4_ = fVar15;
      auVar7._0_4_ = fVar13;
      auVar7._8_4_ = fVar16;
      auVar7._12_4_ = fVar17;
      auVar11 = maxps(auVar12,auVar7);
      fVar14 = max->z;
      if (max->z <= fVar18) {
        fVar14 = fVar18;
      }
      max->x = (float)(int)auVar11._0_8_;
      max->y = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
      max->z = fVar14;
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0xc;
    } while (uVar9 < mesh->mNumVertices);
  }
  return;
}

Assistant:

void FindAABBTransformed (const aiMesh* mesh, aiVector3D& min, aiVector3D& max,
    const aiMatrix4x4& m)
{
    min = aiVector3D ( ai_real( 10e10 ), ai_real( 10e10 ), ai_real( 10e10 ) );
    max = aiVector3D ( ai_real( -10e10 ), ai_real( -10e10 ), ai_real( -10e10 ) );
    for (unsigned int i = 0;i < mesh->mNumVertices;++i)
    {
        const aiVector3D v = m * mesh->mVertices[i];
        min = std::min(v,min);
        max = std::max(v,max);
    }
}